

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O0

int s2_semi_mgau_frame_eval
              (ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,int32 n_senone_active,
              mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *local_58;
  vqFeature_t **lastf;
  int n_feat;
  int topn_idx;
  int i;
  s2_semi_mgau_t *s;
  int32 frame_local;
  mfcc_t **featbuf_local;
  int32 n_senone_active_local;
  uint8 *senone_active_local;
  int16 *senone_scores_local;
  ps_mgau_t *ps_local;
  
  iVar1 = *(int *)(*(long *)&ps[1].frame_idx + 0x24);
  memset(senone_scores,0,(long)ps[3].frame_idx << 1);
  iVar3 = frame % ps[6].frame_idx;
  ps[6].vt = (ps_mgaufuncs_t *)(&(ps[5].vt)->name)[iVar3];
  for (n_feat = 0; n_feat < iVar1; n_feat = n_feat + 1) {
    if (ps->frame_idx <= frame) {
      if (iVar3 == 0) {
        local_58 = (&(ps[5].vt)->name)[ps[6].frame_idx + -1];
      }
      else {
        local_58 = (&(ps[5].vt)->name)[iVar3 + -1];
      }
      memcpy((&(ps[6].vt)->name)[n_feat],*(void **)(local_58 + (long)n_feat * 8),
             (long)(short)ps[4].frame_idx << 3);
      mgau_dist((s2_semi_mgau_t *)ps,frame,n_feat,featbuf[n_feat]);
      iVar2 = mgau_norm((s2_semi_mgau_t *)ps,n_feat);
      *(char *)(*(long *)(*(long *)&ps[5].frame_idx + (long)iVar3 * 8) + (long)n_feat) = (char)iVar2
      ;
    }
    if (ps[3].vt == (ps_mgaufuncs_t *)0x0) {
      if (compallsen == 0) {
        get_scores_8b_feat((s2_semi_mgau_t *)ps,n_feat,
                           (uint)*(byte *)(*(long *)(*(long *)&ps[5].frame_idx + (long)iVar3 * 8) +
                                          (long)n_feat),senone_scores,senone_active,n_senone_active)
        ;
      }
      else {
        get_scores_8b_feat_all
                  ((s2_semi_mgau_t *)ps,n_feat,
                   (uint)*(byte *)(*(long *)(*(long *)&ps[5].frame_idx + (long)iVar3 * 8) +
                                  (long)n_feat),senone_scores);
      }
    }
    else if (compallsen == 0) {
      get_scores_4b_feat((s2_semi_mgau_t *)ps,n_feat,
                         (uint)*(byte *)(*(long *)(*(long *)&ps[5].frame_idx + (long)iVar3 * 8) +
                                        (long)n_feat),senone_scores,senone_active,n_senone_active);
    }
    else {
      get_scores_4b_feat_all
                ((s2_semi_mgau_t *)ps,n_feat,
                 (uint)*(byte *)(*(long *)(*(long *)&ps[5].frame_idx + (long)iVar3 * 8) +
                                (long)n_feat),senone_scores);
    }
  }
  return 0;
}

Assistant:

int32
s2_semi_mgau_frame_eval(ps_mgau_t *ps,
                        int16 *senone_scores,
                        uint8 *senone_active,
                        int32 n_senone_active,
			mfcc_t ** featbuf, int32 frame,
			int32 compallsen)
{
    s2_semi_mgau_t *s = (s2_semi_mgau_t *)ps;
    int i, topn_idx;
    int n_feat = s->g->n_feat;

    memset(senone_scores, 0, s->n_sen * sizeof(*senone_scores));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= ps_mgau_base(ps)->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        if (s->mixw_cb) {
            if (compallsen)
                get_scores_4b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_4b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
        else {
            if (compallsen)
                get_scores_8b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
    }

    return 0;
}